

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O2

void __thiscall
avro::detail::BufferImpl::copyData
          (BufferImpl *this,BufferImpl *dest,const_iterator *iter,size_type offset,size_type bytes)

{
  data_type **ppdVar1;
  _Map_pointer ppCVar2;
  Chunk *pCVar3;
  data_type *pdVar4;
  _Elt_pointer pCVar5;
  data_type *pdVar6;
  data_type *pdVar7;
  
  for (pdVar7 = (data_type *)0x0; pdVar7 <= bytes && bytes - (long)pdVar7 != 0;
      pdVar7 = pdVar4 + ((long)pdVar7 - (long)pdVar6)) {
    std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::push_back
              (&dest->readChunks_,iter->_M_cur);
    pCVar5 = (dest->readChunks_).
             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pCVar5 == (dest->readChunks_).
                  super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppCVar2 = (dest->readChunks_).
                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl
                .super__Deque_impl_data._M_finish._M_node;
      ppdVar1 = &ppCVar2[-1][8].readPos_;
      *ppdVar1 = *ppdVar1 + offset;
      pCVar3 = ppCVar2[-1];
      pdVar6 = pCVar3[8].readPos_;
      pCVar5 = pCVar3 + 9;
    }
    else {
      pdVar6 = pCVar5[-1].readPos_ + offset;
      pCVar5[-1].readPos_ = pdVar6;
    }
    pdVar4 = pCVar5[-1].writePos_;
    std::
    _Deque_iterator<avro::detail::Chunk,_const_avro::detail::Chunk_&,_const_avro::detail::Chunk_*>::
    operator++(iter);
    offset = 0;
  }
  pCVar5 = (dest->readChunks_).
           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pCVar5 == (dest->readChunks_).
                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pCVar5 = (dest->readChunks_).
             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 9;
  }
  pCVar5[-1].writePos_ = pCVar5[-1].writePos_ + (bytes - (long)pdVar7);
  dest->size_ = dest->size_ + bytes;
  return;
}

Assistant:

void copyData(BufferImpl &dest, 
                  ChunkList::const_iterator iter,
                  size_type offset, 
                  size_type bytes) const
    {
        // now we are positioned to start the copying, copy as many
        // chunks as we need, the first chunk may have a non-zero offset 
        // if the data to copy is not at the start of the chunk 
        size_type copied = 0;
        while(copied < bytes) {

            dest.readChunks_.push_back(*iter);

            // offset only applies in the first chunk, 
            // all subsequent chunks are copied from the start
            dest.readChunks_.back().truncateFront(offset);
            offset = 0;

            copied += dest.readChunks_.back().dataSize(); 
            ++iter;
        }

        // if the last chunk copied has more bytes than we need, truncate it
        size_type excess = copied - bytes;
        dest.readChunks_.back().truncateBack(excess);

        dest.size_ += bytes;
    }